

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

carrier_uint
fmt::v7::detail::dragonbox::cache_accessor<double>::compute_round_up_for_shorter_interval_case
          (cache_entry_type *cache,int beta_minus_1)

{
  uint64_t uVar1;
  char in_SIL;
  uint128_wrapper *in_RDI;
  
  uVar1 = uint128_wrapper::high(in_RDI);
  return (uVar1 >> (10U - in_SIL & 0x3f)) + 1 >> 1;
}

Assistant:

static carrier_uint compute_round_up_for_shorter_interval_case(
      const cache_entry_type& cache, int beta_minus_1) FMT_NOEXCEPT {
    return ((cache.high() >>
             (64 - float_info<double>::significand_bits - 2 - beta_minus_1)) +
            1) /
           2;
  }